

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3_cancel_auto_extension(_func_void *xInit)

{
  sqlite3_mutex *p;
  int local_20;
  u32 local_1c;
  int n;
  int i;
  sqlite3_mutex *mutex;
  _func_void *xInit_local;
  
  p = sqlite3MutexAlloc(2);
  local_20 = 0;
  sqlite3_mutex_enter(p);
  local_1c = sqlite3Autoext.nExt;
  do {
    local_1c = local_1c - 1;
    if ((int)local_1c < 0) goto LAB_0012e0e8;
  } while (sqlite3Autoext.aExt[(int)local_1c] != xInit);
  sqlite3Autoext.nExt = sqlite3Autoext.nExt - 1;
  sqlite3Autoext.aExt[(int)local_1c] = sqlite3Autoext.aExt[sqlite3Autoext.nExt];
  local_20 = 1;
LAB_0012e0e8:
  sqlite3_mutex_leave(p);
  return local_20;
}

Assistant:

SQLITE_API int sqlite3_cancel_auto_extension(
  void (*xInit)(void)
){
#if SQLITE_THREADSAFE
  sqlite3_mutex *mutex = sqlite3MutexAlloc(SQLITE_MUTEX_STATIC_MAIN);
#endif
  int i;
  int n = 0;
  wsdAutoextInit;
  sqlite3_mutex_enter(mutex);
  for(i=(int)wsdAutoext.nExt-1; i>=0; i--){
    if( wsdAutoext.aExt[i]==xInit ){
      wsdAutoext.nExt--;
      wsdAutoext.aExt[i] = wsdAutoext.aExt[wsdAutoext.nExt];
      n++;
      break;
    }
  }
  sqlite3_mutex_leave(mutex);
  return n;
}